

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::PackUnorm2x16CaseInstance::~PackUnorm2x16CaseInstance
          (PackUnorm2x16CaseInstance *this)

{
  PackUnorm2x16CaseInstance *this_local;
  
  ~PackUnorm2x16CaseInstance(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

PackUnorm2x16CaseInstance (Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, glu::Precision precision, const char* name)
	: ShaderPackingFunctionTestInstance	(context, shaderType, spec, name)
	, m_precision						(precision)
	{
	}